

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O1

void Catch::defaultListTags
               (ostream *out,vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *tags,
               bool isFiltered)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pTVar2;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar3;
  size_t sVar4;
  ostream *poVar5;
  undefined7 in_register_00000011;
  long lVar6;
  char *pcVar7;
  pointer this;
  string str;
  ReusableStringStream rss;
  Column wrapper;
  long *local_f8;
  size_t local_f0;
  long local_e8 [2];
  string local_d8;
  vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *local_b8;
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  size_t local_90;
  size_t sStack_88;
  size_t sStack_80;
  ReusableStringStream local_78;
  Column local_68;
  
  if ((int)CONCAT71(in_register_00000011,isFiltered) == 0) {
    pcVar7 = "All available tags:\n";
    lVar6 = 0x14;
  }
  else {
    pcVar7 = "Tags for matching test cases:\n";
    lVar6 = 0x1e;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar7,lVar6);
  this = (tags->super__Vector_base<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>)._M_impl.
         super__Vector_impl_data._M_start;
  pTVar2 = (tags->super__Vector_base<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_b8 = tags;
  if (this != pTVar2) {
    paVar1 = &local_68.m_string.field_2;
    do {
      pSVar3 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
               getInternal();
      sVar4 = StringStreams::add(&pSVar3->super_StringStreams);
      local_78.m_index = sVar4;
      pSVar3 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
               getInternal();
      poVar5 = (ostream *)
               (pSVar3->super_StringStreams).m_streams.
               super__Vector_base<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[sVar4].m_ptr;
      local_78.m_oss = poVar5;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
      *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 2;
      std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
      std::__cxx11::stringbuf::str();
      TagInfo::all_abi_cxx11_(&local_d8,this);
      local_b0 = local_a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,local_d8._M_dataplus._M_p,
                 local_d8._M_dataplus._M_p + local_d8._M_string_length);
      sStack_80 = 0;
      sStack_88 = local_f0;
      local_90 = 0x46;
      local_68.m_string._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,local_b0,local_a8 + (long)local_b0);
      local_68.m_initialIndent = sStack_80;
      local_68.m_width = local_90;
      local_68.m_indent = sStack_88;
      if (local_b0 != local_a0) {
        operator_delete(local_b0,local_a0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(out,(char *)local_f8,local_f0);
      TextFlow::operator<<(poVar5,&local_68);
      local_b0 = (long *)CONCAT71(local_b0._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_b0,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68.m_string._M_dataplus._M_p != paVar1) {
        operator_delete(local_68.m_string._M_dataplus._M_p,
                        local_68.m_string.field_2._M_allocated_capacity + 1);
      }
      if (local_f8 != local_e8) {
        operator_delete(local_f8,local_e8[0] + 1);
      }
      ReusableStringStream::~ReusableStringStream(&local_78);
      this = this + 1;
    } while (this != pTVar2);
  }
  local_68.m_string._M_dataplus._M_p =
       (pointer)(((long)(local_b8->
                        super__Vector_base<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>)._M_impl
                        .super__Vector_impl_data._M_finish -
                  (long)(local_b8->
                        super__Vector_base<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>)._M_impl
                        .super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
  local_68.m_string._M_string_length = 0x1fa471;
  local_68.m_string.field_2._M_allocated_capacity = 3;
  operator<<(out,(pluralise *)&local_68);
  std::__ostream_insert<char,std::char_traits<char>>(out,"\n\n",2);
  std::ostream::flush();
  return;
}

Assistant:

void defaultListTags( std::ostream& out,
                          std::vector<TagInfo> const& tags,
                          bool isFiltered ) {
        if ( isFiltered ) {
            out << "Tags for matching test cases:\n";
        } else {
            out << "All available tags:\n";
        }

        for ( auto const& tagCount : tags ) {
            ReusableStringStream rss;
            rss << "  " << std::setw( 2 ) << tagCount.count << "  ";
            auto str = rss.str();
            auto wrapper = TextFlow::Column( tagCount.all() )
                               .initialIndent( 0 )
                               .indent( str.size() )
                               .width( CATCH_CONFIG_CONSOLE_WIDTH - 10 );
            out << str << wrapper << '\n';
        }
        out << pluralise(tags.size(), "tag"_sr) << "\n\n" << std::flush;
    }